

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int walIndexPage(Wal *pWal,int iPage,u32 **ppPage)

{
  int iVar1;
  int iVar2;
  u32 **ppuVar3;
  u32 *__s;
  long lVar4;
  
  lVar4 = (long)iPage;
  if (pWal->nWiData <= iPage) {
    ppuVar3 = pWal->apWiData;
    iVar1 = sqlite3_initialize();
    iVar2 = (int)(lVar4 + 1);
    if (iVar1 == 0) {
      ppuVar3 = (u32 **)sqlite3Realloc(ppuVar3,(long)(iVar2 * 8));
    }
    else {
      ppuVar3 = (u32 **)0x0;
    }
    if (ppuVar3 == (u32 **)0x0) {
      *ppPage = (u32 *)0x0;
      return 7;
    }
    memset(ppuVar3 + pWal->nWiData,0,((lVar4 + 1) - (long)pWal->nWiData) * 8);
    pWal->apWiData = ppuVar3;
    pWal->nWiData = iVar2;
  }
  iVar2 = 0;
  if (pWal->apWiData[lVar4] == (u32 *)0x0) {
    if (pWal->exclusiveMode == '\x02') {
      __s = (u32 *)sqlite3Malloc(0x8000);
      if (__s != (u32 *)0x0) {
        memset(__s,0,0x8000);
      }
      pWal->apWiData[lVar4] = __s;
      iVar2 = 7;
      if (pWal->apWiData[lVar4] != (u32 *)0x0) {
        iVar2 = 0;
      }
    }
    else {
      iVar2 = (*pWal->pDbFd->pMethods->xShmMap)
                        (pWal->pDbFd,iPage,0x8000,(int)pWal->writeLock,pWal->apWiData + lVar4);
      if (iVar2 == 8) {
        pWal->readOnly = pWal->readOnly | 2;
        iVar2 = 0;
      }
    }
  }
  *ppPage = pWal->apWiData[lVar4];
  return iVar2;
}

Assistant:

static int walIndexPage(Wal *pWal, int iPage, volatile u32 **ppPage){
  int rc = SQLITE_OK;

  /* Enlarge the pWal->apWiData[] array if required */
  if( pWal->nWiData<=iPage ){
    int nByte = sizeof(u32*)*(iPage+1);
    volatile u32 **apNew;
    apNew = (volatile u32 **)sqlite3_realloc64((void *)pWal->apWiData, nByte);
    if( !apNew ){
      *ppPage = 0;
      return SQLITE_NOMEM_BKPT;
    }
    memset((void*)&apNew[pWal->nWiData], 0,
           sizeof(u32*)*(iPage+1-pWal->nWiData));
    pWal->apWiData = apNew;
    pWal->nWiData = iPage+1;
  }

  /* Request a pointer to the required page from the VFS */
  if( pWal->apWiData[iPage]==0 ){
    if( pWal->exclusiveMode==WAL_HEAPMEMORY_MODE ){
      pWal->apWiData[iPage] = (u32 volatile *)sqlite3MallocZero(WALINDEX_PGSZ);
      if( !pWal->apWiData[iPage] ) rc = SQLITE_NOMEM_BKPT;
    }else{
      rc = sqlite3OsShmMap(pWal->pDbFd, iPage, WALINDEX_PGSZ, 
          pWal->writeLock, (void volatile **)&pWal->apWiData[iPage]
      );
      if( rc==SQLITE_READONLY ){
        pWal->readOnly |= WAL_SHM_RDONLY;
        rc = SQLITE_OK;
      }
    }
  }

  *ppPage = pWal->apWiData[iPage];
  assert( iPage==0 || *ppPage || rc!=SQLITE_OK );
  return rc;
}